

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_perlin.h
# Opt level: O2

float stb_perlin_ridge_noise3
                (float x,float y,float z,float lacunarity,float gain,float offset,int octaves)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  iVar1 = 0;
  if (octaves < 1) {
    octaves = 0;
  }
  fVar2 = 0.0;
  fVar6 = 0.5;
  fVar5 = 1.0;
  fVar4 = 1.0;
  for (; octaves != iVar1; iVar1 = iVar1 + 1) {
    fVar3 = stb_perlin_noise3_internal(fVar5 * x,fVar5 * y,fVar5 * z,0,0,0,(uchar)iVar1);
    fVar3 = (offset - ABS(fVar3)) * (offset - ABS(fVar3));
    fVar2 = fVar2 + fVar6 * fVar3 * fVar4;
    fVar5 = fVar5 * lacunarity;
    fVar6 = fVar6 * gain;
    fVar4 = fVar3;
  }
  return fVar2;
}

Assistant:

float stb_perlin_ridge_noise3(float x, float y, float z, float lacunarity, float gain, float offset, int octaves)
{
   int i;
   float frequency = 1.0f;
   float prev = 1.0f;
   float amplitude = 0.5f;
   float sum = 0.0f;

   for (i = 0; i < octaves; i++) {
      float r = stb_perlin_noise3_internal(x*frequency,y*frequency,z*frequency,0,0,0,(unsigned char)i);
      r = offset - (float) fabs(r);
      r = r*r;
      sum += r*amplitude*prev;
      prev = r;
      frequency *= lacunarity;
      amplitude *= gain;
   }
   return sum;
}